

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O0

void abuf_hexdump(autobuf *out,char *prefix,void *buffer,size_t length)

{
  size_t local_40;
  size_t l;
  size_t j;
  uint8_t *buf;
  size_t length_local;
  void *buffer_local;
  char *prefix_local;
  autobuf *out_local;
  
  for (l = 0; l < length; l = l + 0x20) {
    abuf_appendf(out,"%s%04zx:",prefix,l);
    local_40 = length - l;
    if (0x20 < local_40) {
      local_40 = 0x20;
    }
    _print_hexline(out,(void *)((long)buffer + l),local_40);
    abuf_puts(out,"\n");
  }
  return;
}

Assistant:

void
abuf_hexdump(struct autobuf *out, const char *prefix, const void *buffer, size_t length) {
  const uint8_t *buf;
  size_t j, l;

  buf = buffer;

  for (j = 0; j < length; j += 32) {
    abuf_appendf(out, "%s%04zx:", prefix, j);

    l = length - j;
    if (l > 32) {
      l = 32;
    }
    _print_hexline(out, &buf[j], l);
    abuf_puts(out, "\n");
  }
}